

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildProperty(ObjectModelBuilder *this,string *propertyString,Class *clazz)

{
  long lVar1;
  ostream *poVar2;
  string local_e8 [32];
  string local_c8 [32];
  undefined1 local_a8 [8];
  Property property;
  size_t space;
  string prop;
  Class *clazz_local;
  string *propertyString_local;
  ObjectModelBuilder *this_local;
  
  prop.field_2._8_8_ = clazz;
  string_trim((string *)&space,propertyString);
  lVar1 = std::__cxx11::string::find_last_of((char *)&space,0x14ef98);
  if (lVar1 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: invalid property: ");
    poVar2 = std::operator<<(poVar2,(string *)&space);
    poVar2 = std::operator<<(poVar2," in class: ");
    poVar2 = std::operator<<(poVar2,(string *)prop.field_2._8_8_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    property.type.field_2._8_4_ = 1;
  }
  else {
    Property::Property((Property *)local_a8);
    local_a8 = (undefined1  [8])prop.field_2._8_8_;
    std::__cxx11::string::substr((ulong)local_c8,(ulong)&space);
    std::__cxx11::string::operator=((string *)(property.name.field_2._M_local_buf + 8),local_c8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::substr((ulong)local_e8,(ulong)&space);
    std::__cxx11::string::operator=((string *)&property,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::vector<Property,_std::allocator<Property>_>::push_back
              ((vector<Property,_std::allocator<Property>_> *)(prop.field_2._8_8_ + 0x60),
               (value_type *)local_a8);
    if ((this->m_verbose & 1U) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr," - property: type=\'");
      poVar2 = std::operator<<(poVar2,(string *)(property.name.field_2._M_local_buf + 8));
      poVar2 = std::operator<<(poVar2,"\', name=\'");
      poVar2 = std::operator<<(poVar2,(string *)&property);
      poVar2 = std::operator<<(poVar2,"\'");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    this_local._7_1_ = true;
    property.type.field_2._8_4_ = 1;
    Property::~Property((Property *)local_a8);
  }
  std::__cxx11::string::~string((string *)&space);
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::buildProperty(const std::string &propertyString, Class *clazz)
{
    std::string prop = string_trim(propertyString);
    size_t space = prop.find_last_of(" ");
    if (space == std::string::npos) {
        std::cerr << "error: invalid property: " << prop << " in class: " << clazz->name << std::endl;
        return false;
    }
    Property property;
    property.clazz = clazz;
    property.type = prop.substr(0, space);
    property.name = prop.substr(space+1);

    clazz->properties.push_back(property);

    if (m_verbose)
        std::cerr << " - property: type='" << property.type << "', name='" << property.name << "'" << std::endl;

    return true;
}